

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3ReturningSubqueryCorrelated(Walker *pWalker,Select *pSelect)

{
  byte *pbVar1;
  long *plVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar3 = pSelect->pSrc->nSrc;
  uVar5 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar5 = 0;
  }
  uVar4 = 0;
  do {
    if (uVar5 * 0x48 + 0x48 == uVar4 + 0x48) {
      return 0;
    }
    plVar2 = (long *)((long)&pSelect->pSrc->a[0].pSTab + uVar4);
    uVar4 = uVar4 + 0x48;
  } while ((NameContext *)*plVar2 != (pWalker->u).pNC);
  pbVar1 = (byte *)((long)&pSelect->selFlags + 3);
  *pbVar1 = *pbVar1 | 0x20;
  pWalker->eCode = 1;
  return 0;
}

Assistant:

static int sqlite3ReturningSubqueryCorrelated(Walker *pWalker, Select *pSelect){
  int i;
  SrcList *pSrc;
  assert( pSelect!=0 );
  pSrc = pSelect->pSrc;
  assert( pSrc!=0 );
  for(i=0; i<pSrc->nSrc; i++){
    if( pSrc->a[i].pSTab==pWalker->u.pTab ){
      testcase( pSelect->selFlags & SF_Correlated );
      pSelect->selFlags |= SF_Correlated;
      pWalker->eCode = 1;
      break;
    }
  }
  return WRC_Continue;
}